

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O1

int sync_tcp_connect(sync_device *d,char *host,unsigned_short port)

{
  sync_track **ppsVar1;
  bool bVar2;
  char **ppcVar3;
  char cVar4;
  int __fd;
  int iVar5;
  hostent *phVar6;
  ssize_t sVar7;
  char **ppcVar8;
  long lVar9;
  sockaddr_in sin;
  sockaddr local_c8;
  long local_b8;
  int local_b0;
  
  if (d->sock != -1) {
    close(d->sock);
  }
  phVar6 = gethostbyname(host);
  iVar5 = -1;
  if ((phVar6 != (hostent *)0x0) && (*phVar6->h_addr_list != (char *)0x0)) {
    ppcVar3 = phVar6->h_addr_list;
    do {
      ppcVar8 = ppcVar3 + 1;
      iVar5 = phVar6->h_addrtype;
      local_c8.sa_family = (sa_family_t)iVar5;
      local_c8.sa_data._0_2_ = port << 8 | port >> 8;
      memcpy(local_c8.sa_data + 2,*ppcVar3,(long)phVar6->h_length);
      local_c8.sa_data[6] = '\0';
      local_c8.sa_data[7] = '\0';
      local_c8.sa_data[8] = '\0';
      local_c8.sa_data[9] = '\0';
      local_c8.sa_data[10] = '\0';
      local_c8.sa_data[0xb] = '\0';
      local_c8.sa_data[0xc] = '\0';
      local_c8.sa_data[0xd] = '\0';
      __fd = socket(iVar5,1,0);
      iVar5 = -1;
      if (__fd == -1) {
        cVar4 = '\x04';
      }
      else {
        iVar5 = connect(__fd,&local_c8,0x10);
        if (-1 < iVar5) {
          sVar7 = send(__fd,"hello, synctracker!",0x13,0);
          if (sVar7 == 0x13) {
            sVar7 = recv(__fd,&local_b8,0xc,0);
            if (sVar7 != 0xc) goto LAB_001ab0b0;
            bVar2 = local_b0 != 0x216f6d65 || local_b8 != 0x64202c6f6c6c6568;
            cVar4 = (local_b0 == 0x216f6d65 && local_b8 == 0x64202c6f6c6c6568) * '\x02';
          }
          else {
LAB_001ab0b0:
            close(__fd);
            __fd = -1;
            cVar4 = '\x04';
            bVar2 = false;
          }
          iVar5 = __fd;
          if (!bVar2) goto LAB_001ab0d7;
        }
        close(__fd);
        cVar4 = '\0';
        iVar5 = -1;
      }
LAB_001ab0d7:
    } while ((cVar4 != '\x02') && (ppcVar3 = ppcVar8, *ppcVar8 != (char *)0x0));
  }
  d->sock = iVar5;
  if (iVar5 == -1) {
LAB_001ab170:
    iVar5 = -1;
  }
  else {
    if (0 < (int)d->num_tracks) {
      lVar9 = 0;
      do {
        free(d->tracks[lVar9]->keys);
        ppsVar1 = d->tracks;
        ppsVar1[lVar9]->keys = (track_key *)0x0;
        ppsVar1[lVar9]->num_keys = 0;
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)d->num_tracks);
    }
    if (0 < (int)d->num_tracks) {
      lVar9 = 0;
      do {
        iVar5 = fetch_track_data(d,d->tracks[lVar9]);
        if (iVar5 != 0) {
          close(d->sock);
          d->sock = -1;
          goto LAB_001ab170;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)d->num_tracks);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int sync_tcp_connect(struct sync_device *d, const char *host, unsigned short port)
{
	int i;
	if (d->sock != INVALID_SOCKET)
		closesocket(d->sock);

	d->sock = server_connect(host, port);
	if (d->sock == INVALID_SOCKET)
		return -1;

	for (i = 0; i < (int)d->num_tracks; ++i) {
		free(d->tracks[i]->keys);
		d->tracks[i]->keys = NULL;
		d->tracks[i]->num_keys = 0;
	}

	for (i = 0; i < (int)d->num_tracks; ++i) {
		if (fetch_track_data(d, d->tracks[i])) {
			closesocket(d->sock);
			d->sock = INVALID_SOCKET;
			return -1;
		}
	}
	return 0;
}